

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

ssh_compressor * zlib_compress_init(void)

{
  LZ77Context *ctx;
  undefined8 *puVar1;
  ssh_zlib_compressor *comp;
  Outbuf *out;
  
  ctx = (LZ77Context *)safemalloc(1,0x28,0);
  lz77_init(ctx);
  ctx[1].ictx = (LZ77InternalContext *)&ssh_zlib;
  ctx->literal = zlib_literal;
  ctx->match = zlib_match;
  puVar1 = (undefined8 *)safemalloc(1,0x18,0);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 2) = 0;
  puVar1[1] = 0;
  *(undefined1 *)((long)puVar1 + 0x14) = 1;
  ctx->userdata = puVar1;
  return (ssh_compressor *)(ctx + 1);
}

Assistant:

ssh_compressor *zlib_compress_init(void)
{
    struct Outbuf *out;
    struct ssh_zlib_compressor *comp = snew(struct ssh_zlib_compressor);

    lz77_init(&comp->ectx);
    comp->sc.vt = &ssh_zlib;
    comp->ectx.literal = zlib_literal;
    comp->ectx.match = zlib_match;

    out = snew(struct Outbuf);
    out->outbuf = NULL;
    out->outbits = out->noutbits = 0;
    out->firstblock = true;
    comp->ectx.userdata = out;

    return &comp->sc;
}